

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.cpp
# Opt level: O0

void LoadSingleBuiltin<Sexp*(*)(Sexp*)>(Sexp *activation,char *name,_func_Sexp_ptr_Sexp_ptr *func)

{
  Environment *symbol;
  bool expr;
  size_t extraout_RDX;
  NativeFunction func_00;
  tuple<unsigned_long&,unsigned_long&> local_f0 [23];
  allocator local_d9;
  string local_d8 [32];
  Environment local_b8;
  size_t right;
  size_t up;
  NativeFunction local_78;
  undefined1 local_68 [8];
  f_type stdfnc;
  Sexp *alloced_func;
  FrameProtector __frame_prot;
  ContractFrameProtector local_28;
  ContractFrameProtector __contract_frame;
  _func_Sexp_ptr_Sexp_ptr *func_local;
  char *name_local;
  Sexp *activation_local;
  
  __contract_frame.protected_frame = (ContractFrame *)func;
  name_local = (char *)activation;
  ContractFrameProtector::ContractFrameProtector(&local_28,"LoadSingleBuiltin");
  expr = Sexp::IsActivation((Sexp *)name_local);
  ContractFrameProtector::CheckPrecondition(&local_28,expr,"activation->IsActivation()");
  FrameProtector::FrameProtector((FrameProtector *)&alloced_func,"LoadSingleBuiltin");
  FrameProtector::ProtectValue((FrameProtector *)&alloced_func,(Sexp **)&name_local,"activation");
  stdfnc._M_invoker = (_Invoker_type)0x0;
  FrameProtector::ProtectValue
            ((FrameProtector *)&alloced_func,(Sexp **)&stdfnc._M_invoker,"alloced_func");
  MakeFunction<Sexp*(*)(Sexp*)>
            ((f_type *)local_68,(_func_Sexp_ptr_Sexp_ptr *)__contract_frame.protected_frame);
  std::function<Sexp_*(Sexp_*)>::function
            ((function<Sexp_*(Sexp_*)> *)&up,(function<Sexp_*(Sexp_*)> *)local_68);
  NativeFunction::NativeFunction<Sexp*,Sexp*>(&local_78,(function<Sexp_*(Sexp_*)> *)&up);
  func_00.arity = extraout_RDX;
  func_00.func = (function<Sexp_*(Sexp_**)> *)local_78.arity;
  stdfnc._M_invoker = (_Invoker_type)GcHeap::AllocateNativeFunction((GcHeap *)local_78.func,func_00)
  ;
  std::function<Sexp_*(Sexp_*)>::~function((function<Sexp_*(Sexp_*)> *)&up);
  symbol = g_the_environment;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,name,&local_d9);
  SymbolInterner::InternSymbol((string *)local_d8);
  Environment::DefineGlobal(&local_b8,(size_t)symbol);
  std::tie<unsigned_long,unsigned_long>((unsigned_long *)local_f0,&right);
  std::tuple<unsigned_long&,unsigned_long&>::operator=
            (local_f0,(tuple<unsigned_long,_unsigned_long> *)&local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  Activation::Set(*(Activation **)(name_local + 8),right,
                  (size_t)local_b8.slot_map.
                          super__Vector_base<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (Sexp *)stdfnc._M_invoker);
  std::function<Sexp_*(Sexp_*)>::~function((function<Sexp_*(Sexp_*)> *)local_68);
  FrameProtector::~FrameProtector((FrameProtector *)&alloced_func);
  ContractFrameProtector::~ContractFrameProtector(&local_28);
  return;
}

Assistant:

void LoadSingleBuiltin(Sexp *activation, const char *name, F func) {
  CONTRACT { PRECONDITION(activation->IsActivation()); }